

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::rrb_drop_right<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,uint32_t right)

{
  int *piVar1;
  leaf_node<int,_false> *__s;
  uint32_t uVar2;
  rrb<int,_false,_6> *prVar3;
  leaf_node<int,_false> *plVar4;
  long lVar5;
  tree_node<int,_false> *ptVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  rrb<int,_false,_6> *prVar10;
  uint uVar11;
  uint32_t *puVar12;
  leaf_node<int,_false> *plVar13;
  undefined8 *puVar14;
  char *__function;
  ulong uVar15;
  uint uVar16;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  ref<immutable::rrb_details::tree_node<int,_false>_> root;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_50;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_48;
  rrb<int,_false,_6> *local_40;
  size_t local_38;
  
  if (right == 0) {
    puVar14 = (undefined8 *)malloc(0x28);
    *puVar14 = 0;
    *(undefined4 *)(puVar14 + 1) = 0;
    puVar14[2] = 0;
    puVar14[3] = 0;
    local_50.ptr = (leaf_node<int,_false> *)malloc(0x18);
    (local_50.ptr)->child = (int *)0x0;
    (local_50.ptr)->type = LEAF_NODE;
    (local_50.ptr)->len = 0;
    (local_50.ptr)->_ref_count = 1;
    (local_50.ptr)->guid = 0;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
              ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar14 + 2),&local_50);
    if ((local_50.ptr != (leaf_node<int,_false> *)0x0) &&
       (uVar2 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
      free(local_50.ptr);
    }
    *(undefined8 **)this = puVar14;
    *(undefined4 *)(puVar14 + 4) = 1;
    return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
  }
  prVar3 = in->ptr;
  if (prVar3 != (rrb<int,_false,_6> *)0x0) {
    if (prVar3->cnt <= right) {
      *(rrb<int,_false,_6> **)this = prVar3;
      prVar3->_ref_count = prVar3->_ref_count + 1;
      return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
    }
    uVar11 = prVar3->cnt - prVar3->tail_len;
    uVar16 = right - uVar11;
    if (right < uVar11 || uVar16 == 0) {
      puVar14 = (undefined8 *)malloc(0x28);
      *puVar14 = 0;
      *(undefined4 *)(puVar14 + 1) = 0;
      puVar14[2] = 0;
      puVar14[3] = 0;
      local_50.ptr = (leaf_node<int,_false> *)malloc(0x18);
      (local_50.ptr)->child = (int *)0x0;
      (local_50.ptr)->type = LEAF_NODE;
      (local_50.ptr)->len = 0;
      (local_50.ptr)->_ref_count = 1;
      (local_50.ptr)->guid = 0;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar14 + 2),&local_50);
      if ((local_50.ptr != (leaf_node<int,_false> *)0x0) &&
         (uVar2 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
        free(local_50.ptr);
      }
      *(undefined8 **)this = puVar14;
      *(undefined4 *)(puVar14 + 4) = 1;
      prVar3 = in->ptr;
      if (prVar3 != (rrb<int,_false,_6> *)0x0) {
        rrb_drop_right_rec<int,false,6>
                  ((rrb_details *)&local_48,(uint32_t *)((long)puVar14 + 4),&prVar3->root,right - 1,
                   prVar3->shift,false);
        puVar12 = *(uint32_t **)this;
        if (puVar12 != (uint32_t *)0x0) {
          *puVar12 = right;
          if (local_48.ptr != (tree_node<int,_false> *)0x0) {
            (local_48.ptr)->_ref_count = (local_48.ptr)->_ref_count + 1;
          }
          local_50.ptr = *(leaf_node<int,_false> **)(puVar12 + 6);
          *(tree_node<int,_false> **)(puVar12 + 6) = local_48.ptr;
          ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_50);
          promote_rightmost_leaf<int,false,6>((ref<immutable::rrb<int,_false,_6>_> *)this);
          lVar5 = *(long *)this;
          if (lVar5 != 0) {
            if (*(long *)(lVar5 + 0x10) != 0) {
              *(undefined4 *)(lVar5 + 8) = *(undefined4 *)(*(long *)(lVar5 + 0x10) + 4);
              ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_48);
              return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
            }
            goto LAB_00148049;
          }
        }
      }
    }
    else {
      puVar12 = (uint32_t *)malloc(0x28);
      uVar2 = prVar3->cnt;
      uVar7 = prVar3->shift;
      uVar8 = prVar3->tail_len;
      uVar9 = *(undefined4 *)&prVar3->field_0xc;
      ptVar6 = (prVar3->root).ptr;
      *(leaf_node<int,_false> **)(puVar12 + 4) = (prVar3->tail).ptr;
      *(tree_node<int,_false> **)(puVar12 + 6) = ptVar6;
      puVar12[0] = uVar2;
      puVar12[1] = uVar7;
      puVar12[2] = uVar8;
      puVar12[3] = uVar9;
      uVar9 = *(undefined4 *)&prVar3->field_0x24;
      puVar12[8] = prVar3->_ref_count;
      puVar12[9] = uVar9;
      if (*(long *)(puVar12 + 6) != 0) {
        piVar1 = (int *)(*(long *)(puVar12 + 6) + 8);
        *piVar1 = *piVar1 + 1;
      }
      if (*(long *)(puVar12 + 4) != 0) {
        piVar1 = (int *)(*(long *)(puVar12 + 4) + 8);
        *piVar1 = *piVar1 + 1;
      }
      *(uint32_t **)this = puVar12;
      puVar12[8] = 1;
      local_38 = (ulong)uVar16 * 4;
      local_40 = (rrb<int,_false,_6> *)this;
      plVar13 = (leaf_node<int,_false> *)malloc((ulong)uVar16 * 4 + 0x18);
      plVar13->len = uVar16;
      plVar13->type = LEAF_NODE;
      __s = plVar13 + 1;
      plVar13->child = (int *)__s;
      plVar13->guid = 0;
      memset(__s,0,local_38);
      prVar10 = local_40;
      plVar13->_ref_count = 1;
      plVar4 = (prVar3->tail).ptr;
      local_50.ptr = plVar13;
      if (plVar4 == (leaf_node<int,_false> *)0x0) {
LAB_00148049:
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
        ;
        goto LAB_0014803f;
      }
      piVar1 = plVar4->child;
      uVar15 = 0;
      do {
        (&__s->type)[uVar15] = piVar1[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar16 + (uVar16 == 0) != uVar15);
      *puVar12 = right;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar12 + 4),&local_50);
      if (*(long *)prVar10 != 0) {
        *(uint *)(*(long *)prVar10 + 8) = uVar16;
        if (local_50.ptr == (leaf_node<int,_false> *)0x0) {
          return (ref<immutable::rrb<int,_false,_6>_>)prVar10;
        }
        uVar2 = (local_50.ptr)->_ref_count;
        (local_50.ptr)->_ref_count = uVar2 - 1;
        if (uVar2 != 1) {
          return (ref<immutable::rrb<int,_false,_6>_>)prVar10;
        }
        free(local_50.ptr);
        return (ref<immutable::rrb<int,_false,_6>_>)prVar10;
      }
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0014803f:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_right(ref<rrb<T, atomic_ref_counting, N>> in, const uint32_t right)
      {
      using namespace rrb_details;
      if (right == 0)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (right < in->cnt)
        {
        const uint32_t tail_offset = in->cnt - in->tail_len;
        // Can just cut the tail slightly
        if (tail_offset < right)
          {
          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
          const uint32_t new_tail_len = right - tail_offset;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);
          //memcpy(new_tail->child, in->tail->child, new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          new_rrb->cnt = right;
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<tree_node<T, atomic_ref_counting>> root = rrb_drop_right_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, right - 1, in->shift, false);
        new_rrb->cnt = right;
        new_rrb->root = root;

        // Not sure if this is necessary in this part of the program, due to issues
        // wrt. rrb_drop_left and roots without size tables.
        promote_rightmost_leaf(new_rrb);
        new_rrb->tail_len = new_rrb->tail->len;
        return new_rrb;
        }
      else
        {
        return in;
        }
      }